

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O0

SiameseResult
siamese_decode(SiameseDecoder decoder_t,SiameseOriginalPacket **packetsPtrOut,uint *countOut)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Decoder *decoder;
  undefined4 local_4;
  
  if ((in_RDI == 0) || ((in_RSI == 0) != (in_RDX == 0))) {
    local_4 = Siamese_InvalidInput;
  }
  else {
    local_4 = siamese::Decoder::Decode
                        ((Decoder *)packetsPtrOut,(SiameseOriginalPacket **)countOut,(uint *)decoder
                        );
  }
  return local_4;
}

Assistant:

SIAMESE_EXPORT SiameseResult siamese_decode(
    SiameseDecoder decoder_t,
    SiameseOriginalPacket** packetsPtrOut,
    unsigned* countOut)
{
    siamese::Decoder* decoder = reinterpret_cast<siamese::Decoder*>(decoder_t);
    if (!decoder || (!packetsPtrOut != !countOut))
        return Siamese_InvalidInput;

    return decoder->Decode(
        packetsPtrOut,
        countOut);
}